

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent(InMemoryDirectory *this,StringPtr name)

{
  Impl *pIVar1;
  EntryImpl *pEVar2;
  ReadableDirectory *extraout_RDX;
  Impl *lock_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> LVar3;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar4;
  StringPtr name_00;
  EntryImpl *entry;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> local_60;
  undefined1 local_50 [16];
  EntryImpl *_entry1746;
  undefined1 local_38 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  InMemoryDirectory *this_local;
  StringPtr name_local;
  
  name_00.content.size_ = name.content.size_;
  lock_00 = (Impl *)name.content.ptr;
  lock.ptr = lock_00;
  LVar3 = MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                    ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_38);
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&local_60,
             &(lock_00->entries)._M_t._M_impl.super__Rb_tree_header,LVar3.ptr);
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::operator->(&local_60);
  name_00.content.ptr = (char *)pIVar1;
  Impl::tryGetEntry((Impl *)local_50,name_00);
  pEVar2 = _::readMaybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_const>
                     ((Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> *)
                      local_50);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&local_60);
  local_50._8_8_ = pEVar2;
  if (pEVar2 == (EntryImpl *)0x0) {
    Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)this);
  }
  else {
    asDirectory(this,(Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)lock_00,
                (EntryImpl *)local_38);
  }
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_38);
  MVar4.ptr.ptr = extraout_RDX;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<Own<const ReadableDirectory>> tryGetParent(kj::StringPtr name) const {
    auto lock = impl.lockShared();
    KJ_IF_SOME(entry, impl.lockShared()->tryGetEntry(name)) {
      return asDirectory(lock, entry);
    } else {
      return kj::none;
    }
  }